

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_ManFindBoolCutCost(Ivy_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  
  if ((*(uint *)&pObj->field_0x8 & 0x10) == 0) {
    __assert_fail("pObj->fMarkA == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                  ,0x118,"int Ivy_ManFindBoolCutCost(Ivy_Obj_t *)");
  }
  uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
  iVar1 = 999;
  if ((uVar2 != 1) && (uVar2 != 4)) {
    if (uVar2 == 7) {
      return (int)((*(byte *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 8) & 0x10) == 0);
    }
    iVar1 = (uint)((*(byte *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 8) & 0x10) == 0) +
            (uint)((*(byte *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 8) & 0x10) == 0);
  }
  return iVar1;
}

Assistant:

int Ivy_ManFindBoolCutCost( Ivy_Obj_t * pObj )
{
    int Cost;
    // make sure the node is in the construction zone
    assert( pObj->fMarkA == 1 );  
    // cannot expand over the PI node
    if ( Ivy_ObjIsCi(pObj) )
        return 999;
    // always expand over the buffer
    if ( Ivy_ObjIsBuf(pObj) )
        return !Ivy_ObjFanin0(pObj)->fMarkA;
    // get the cost of the cone
    Cost = (!Ivy_ObjFanin0(pObj)->fMarkA) + (!Ivy_ObjFanin1(pObj)->fMarkA);
    // return the number of nodes to be added to the leaves if this node is removed
    return Cost;
}